

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_parser.c
# Opt level: O0

gnode_t * parse_class_declaration
                    (gravity_parser_t *parser,gtoken_t access_specifier,gtoken_t storage_specifier)

{
  gravity_lexer_t *lexer_00;
  long lVar1;
  size_t sVar2;
  gtoken_s token_00;
  gtoken_s token_01;
  gtoken_s token_02;
  _Bool _Var3;
  gnode_t *pgVar4;
  char *pcVar5;
  void *pvVar6;
  gnode_t **ppgVar7;
  gnode_t *pgVar8;
  size_t local_180;
  _Bool local_171;
  size_t local_170;
  gnode_t *local_168;
  size_t local_138;
  gnode_t *local_130;
  long local_120;
  gnode_t *local_118;
  char *class_manifest_type;
  gnode_t *decl;
  gnode_class_decl_t *node;
  undefined8 uStack_e8;
  undefined8 local_e0;
  undefined8 uStack_d8;
  char *local_d0;
  gnode_t *local_c8;
  gnode_t *outer_decl;
  undefined8 uStack_b8;
  undefined8 local_b0;
  undefined8 uStack_a8;
  char *local_a0;
  gnode_t *local_98;
  gnode_t *outer_var;
  gnode_r *decls;
  gnode_r *declarations;
  gnode_r *pgStack_78;
  gtoken_t peek;
  gnode_r *protocols;
  gnode_t *super;
  char *identifier;
  undefined1 auStack_58 [7];
  _Bool is_struct;
  gtoken_s token;
  gtoken_t type;
  gravity_lexer_t *lexer;
  gtoken_t storage_specifier_local;
  gtoken_t access_specifier_local;
  gravity_parser_t *parser_local;
  
  lexer_00 = parser->lexer->p[parser->lexer->n - 1];
  token.value._4_4_ = gravity_lexer_next(lexer_00);
  gravity_lexer_token((gtoken_s *)auStack_58,lexer_00);
  identifier._7_1_ = token.value._4_4_ == TOK_KEY_STRUCT;
  super = (gnode_t *)parse_identifier(parser);
  protocols = (gnode_r *)0x0;
  pgStack_78 = (gnode_r *)0x0;
  declarations._4_4_ = gravity_lexer_peek(lexer_00);
  if (declarations._4_4_ == TOK_OP_COLON) {
    gravity_lexer_next(lexer_00);
    protocols = (gnode_r *)parse_id(parser);
  }
  declarations._4_4_ = gravity_lexer_peek(lexer_00);
  if (declarations._4_4_ == TOK_OP_LESS) {
    gravity_lexer_next(lexer_00);
    pgStack_78 = parse_protocols(parser);
    parse_required(parser,TOK_OP_GREATER);
  }
  if (storage_specifier != TOK_KEY_EXTERN) {
    parse_required(parser,TOK_OP_OPEN_CURLYBRACE);
  }
  decls = gnode_array_create();
  pgVar4 = get_enclosing(parser,NODE_CLASS_DECL);
  if (pgVar4 != (gnode_t *)0x0) {
    outer_var = (gnode_t *)gnode_array_create();
    memset(&outer_decl,0,0x28);
    pcVar5 = string_dup("outer");
    if (parser->declarations->n == 0) {
      local_118 = (gnode_t *)0x0;
    }
    else {
      local_118 = parser->declarations->p[parser->declarations->n - 1];
    }
    token_00.colno = (undefined4)uStack_b8;
    token_00.position = uStack_b8._4_4_;
    token_00._0_8_ = outer_decl;
    token_00.bytes = (undefined4)local_b0;
    token_00.length = local_b0._4_4_;
    token_00.fileid = (undefined4)uStack_a8;
    token_00.builtin = uStack_a8._4_4_;
    token_00.value = local_a0;
    local_98 = gnode_variable_create
                         (token_00,pcVar5,(char *)0x0,(gnode_t *)0x0,local_118,
                          (gnode_variable_decl_t *)0x0);
    lVar1._0_4_ = outer_var->tag;
    lVar1._4_4_ = outer_var->refcount;
    if (lVar1 == *(long *)&outer_var->block_length) {
      if (*(long *)&outer_var->block_length == 0) {
        local_120 = 8;
      }
      else {
        local_120 = *(long *)&outer_var->block_length << 1;
      }
      *(long *)&outer_var->block_length = local_120;
      pvVar6 = realloc(*(void **)&outer_var->token,*(long *)&outer_var->block_length << 3);
      *(void **)&outer_var->token = pvVar6;
    }
    lVar1 = *(long *)outer_var;
    *(long *)outer_var = lVar1 + 1;
    *(gnode_t **)(*(long *)&outer_var->token + lVar1 * 8) = local_98;
    memset(&node,0,0x28);
    if (parser->declarations->n == 0) {
      local_130 = (gnode_t *)0x0;
    }
    else {
      local_130 = parser->declarations->p[parser->declarations->n - 1];
    }
    token_01.colno = (undefined4)uStack_e8;
    token_01.position = uStack_e8._4_4_;
    token_01._0_8_ = node;
    token_01.bytes = (undefined4)local_e0;
    token_01.length = local_e0._4_4_;
    token_01.fileid = (undefined4)uStack_d8;
    token_01.builtin = uStack_d8._4_4_;
    token_01.value = local_d0;
    local_c8 = gnode_variable_decl_create
                         (token_01,TOK_KEY_VAR,TOK_KEY_PRIVATE,TOK_EOF,(gnode_r *)outer_var,
                          local_130);
    if (decls->n == decls->m) {
      if (decls->m == 0) {
        local_138 = 8;
      }
      else {
        local_138 = decls->m << 1;
      }
      decls->m = local_138;
      ppgVar7 = (gnode_t **)realloc(decls->p,decls->m << 3);
      decls->p = ppgVar7;
    }
    sVar2 = decls->n;
    decls->n = sVar2 + 1;
    decls->p[sVar2] = local_c8;
  }
  if (parser->declarations->n == 0) {
    local_168 = (gnode_t *)0x0;
  }
  else {
    local_168 = parser->declarations->p[parser->declarations->n - 1];
  }
  token_02.colno = token.type;
  token_02.position = token.lineno;
  token_02.type = auStack_58._0_4_;
  token_02.lineno = stack0xffffffffffffffac;
  token_02.bytes = token.colno;
  token_02.length = token.position;
  token_02.fileid = token.bytes;
  token_02.builtin = token.length;
  token_02.value = (char *)token._24_8_;
  parser_local = (gravity_parser_t *)
                 gnode_class_decl_create
                           (token_02,(char *)super,access_specifier,storage_specifier,
                            (gnode_t *)protocols,pgStack_78,(gnode_r *)0x0,
                            (_Bool)(identifier._7_1_ & 1),local_168);
  if (storage_specifier != TOK_KEY_EXTERN) {
    if (parser->declarations->n == parser->declarations->m) {
      if (parser->declarations->m == 0) {
        local_170 = 8;
      }
      else {
        local_170 = parser->declarations->m << 1;
      }
      parser->declarations->m = local_170;
      ppgVar7 = (gnode_t **)realloc(parser->declarations->p,parser->declarations->m << 3);
      parser->declarations->p = ppgVar7;
    }
    ppgVar7 = parser->declarations->p;
    sVar2 = parser->declarations->n;
    parser->declarations->n = sVar2 + 1;
    ppgVar7[sVar2] = (gnode_t *)parser_local;
    declarations._4_4_ = gravity_lexer_peek(lexer_00);
    while( true ) {
      _Var3 = token_isdeclaration_statement(declarations._4_4_);
      local_171 = true;
      if (!_Var3) {
        local_171 = token_ismacro(declarations._4_4_);
      }
      if (local_171 == false) break;
      pgVar4 = parse_declaration_statement(parser);
      if (pgVar4 != (gnode_t *)0x0) {
        if (decls->n == decls->m) {
          if (decls->m == 0) {
            local_180 = 8;
          }
          else {
            local_180 = decls->m << 1;
          }
          decls->m = local_180;
          ppgVar7 = (gnode_t **)realloc(decls->p,decls->m << 3);
          decls->p = ppgVar7;
        }
        pgVar4 = decl_check_access_specifier(pgVar4);
        sVar2 = decls->n;
        decls->n = sVar2 + 1;
        decls->p[sVar2] = pgVar4;
      }
      declarations._4_4_ = gravity_lexer_peek(lexer_00);
    }
    parser->declarations->n = parser->declarations->n - 1;
  }
  if (storage_specifier != TOK_KEY_EXTERN) {
    parse_required(parser,TOK_OP_CLOSED_CURLYBRACE);
  }
  parse_semicolon(parser);
  parser_local[1].vdecl.n = (size_t)decls;
  pcVar5 = gravity_class_class->identifier;
  pgVar8 = get_enclosing(parser,NODE_FUNCTION_DECL);
  pgVar4 = super;
  if (pgVar8 != (gnode_t *)0x0) {
    pcVar5 = string_dup(pcVar5);
    parser_local = (gravity_parser_t *)
                   local_store_declaration
                             (parser,(char *)pgVar4,pcVar5,access_specifier,storage_specifier,
                              (gnode_t *)parser_local);
  }
  return (gnode_t *)parser_local;
}

Assistant:

static gnode_t *parse_class_declaration (gravity_parser_t *parser, gtoken_t access_specifier, gtoken_t storage_specifier) {
    DEBUG_PARSER("parse_class_declaration");
    DECLARE_LEXER;

    // access_specifier? storage_specifier? 'class' IDENTIFIER class_superclass? class_protocols? '{' declaration_statement* '}' ';'
    // class_superclass: (':') id
    // class_protocols: '<' (id) (',' id)* '>'

    // optional scope already consumed (when here I am sure type is TOK_KEY_CLASS or TOK_KEY_STRUCT)
    gtoken_t type = gravity_lexer_next(lexer);
    gtoken_s token = gravity_lexer_token(lexer);
    bool is_struct = (type == TOK_KEY_STRUCT);

    // parse IDENTIFIER
    const char *identifier = parse_identifier(parser);

    // check for optional superclass
    gnode_t *super = NULL;
    gnode_r *protocols = NULL;
    gtoken_t peek = gravity_lexer_peek(lexer);
    if (peek == TOK_OP_COLON) {
        gravity_lexer_next(lexer); // consume TOK_OP_COLON
        super = parse_id(parser);
    }

    // check for optional protocols (not supported in this version)
    peek = gravity_lexer_peek(lexer);
    if (peek == TOK_OP_LESS) {
        gravity_lexer_next(lexer); // consume '<'
        protocols = parse_protocols(parser);
        parse_required(parser, TOK_OP_GREATER);  // consume '>'
    }

    // check and consume TOK_OP_OPEN_CURLYBRACE
    if (storage_specifier != TOK_KEY_EXTERN) parse_required(parser, TOK_OP_OPEN_CURLYBRACE);
    gnode_r *declarations = gnode_array_create();

    // if class is declared inside another class then a hidden implicit private "outer" instance var at index 0
    // is automatically added
    if (IS_CLASS_ENCLOSED()) {
        gnode_r *decls = gnode_array_create();
        gnode_t *outer_var = gnode_variable_create(NO_TOKEN, string_dup(OUTER_IVAR_NAME), NULL, NULL, LAST_DECLARATION(), NULL);
        gnode_array_push(decls, outer_var);

        gnode_t *outer_decl = gnode_variable_decl_create(NO_TOKEN, TOK_KEY_VAR, TOK_KEY_PRIVATE, 0, decls, LAST_DECLARATION());
        gnode_array_push(declarations, outer_decl);
    }

    // create class declaration node
    gnode_class_decl_t *node = (gnode_class_decl_t*) gnode_class_decl_create(token, identifier, access_specifier, storage_specifier, super, protocols, NULL, is_struct, LAST_DECLARATION());

    if (storage_specifier != TOK_KEY_EXTERN) {
        PUSH_DECLARATION(node);
        peek = gravity_lexer_peek(lexer);
        while (token_isdeclaration_statement(peek) || token_ismacro(peek)) {
            gnode_t *decl = parse_declaration_statement(parser);
            if (decl) gnode_array_push(declarations, decl_check_access_specifier(decl));
            peek = gravity_lexer_peek(lexer);
        }
        POP_DECLARATION();
    }

    // check and consume TOK_OP_CLOSED_CURLYBRACE
    if (storage_specifier != TOK_KEY_EXTERN) parse_required(parser, TOK_OP_CLOSED_CURLYBRACE);

    // to check
    parse_semicolon(parser);

    // finish setup node class
    node->decls = declarations;

    const char *class_manifest_type = gravity_class_class->identifier;
    if (IS_FUNCTION_ENCLOSED()) return local_store_declaration(parser, identifier, string_dup(class_manifest_type), access_specifier, storage_specifier, (gnode_t *)node);
    return (gnode_t *)node;
}